

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::CBufferData<glcts::(anonymous_namespace)::test_api::ES3>::Run
          (CBufferData<glcts::(anonymous_namespace)::test_api::ES3> *this)

{
  allocator<unsigned_int> *this_00;
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  long lVar4;
  DILogger local_1d60;
  DILogger local_1be0;
  DILogger local_1a60;
  DILogger local_18e0;
  DILogger local_1760;
  undefined1 local_15e0 [8];
  CDataArray dataRef9;
  DILogger local_1448;
  DILogger local_12c8;
  undefined1 local_1148 [8];
  CDataArray dataRef7;
  DILogger local_fb0;
  undefined1 local_e30 [8];
  CDataArray dataRef6;
  DILogger local_c98;
  undefined1 local_b18 [8];
  CDataArray dataRef5;
  DILogger local_980;
  DILogger local_800;
  DILogger local_680;
  undefined1 local_500 [8];
  CDataArray dataRef2;
  DILogger local_368;
  undefined1 local_1e8 [8];
  CDataArray dataRef1;
  undefined1 local_1c8 [8];
  CDataArray dataTest;
  uint local_1a0;
  uint local_19c;
  int dataHeight;
  int dataWidth;
  DIResult result;
  CBufferData<glcts::(anonymous_namespace)::test_api::ES3> *this_local;
  
  result.status_ = (long)this;
  DIResult::DIResult((DIResult *)&dataHeight);
  DrawIndirectBase::getDataSize(&this->super_DrawIndirectBase,(int *)&local_19c,(int *)&local_1a0);
  iVar1 = local_19c * local_1a0;
  dataRef1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  this_00 = (allocator<unsigned_int> *)
            ((long)&dataRef1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<unsigned_int>::allocator(this_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,(long)iVar1,
             (value_type_conflict4 *)
             ((long)&dataRef1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4),this_00);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&dataRef1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             10,this->_buffers);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e8);
  DrawIndirectBase::DataGen<unsigned_int>
            (&this->super_DrawIndirectBase,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e8,local_19c,local_1a0,0,
             0x32);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,this->_buffers[1]);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e8);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e8,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,sVar2 << 2,pvVar3,0x88e8);
  lVar4 = DrawIndirectBase::BindingPointCheck<glcts::(anonymous_namespace)::test_api::ES3>
                    (&this->super_DrawIndirectBase,this->_buffers[1]);
  DIResult::sub_result(&local_368,(DIResult *)&dataHeight,lVar4);
  DILogger::~DILogger(&local_368);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,0);
  DrawIndirectBase::GetBufferSubData<glcts::(anonymous_namespace)::test_api::ES3>
            (&this->super_DrawIndirectBase,0x8f3f,0,sVar2 << 2,pvVar3);
  lVar4 = DrawIndirectBase::DataCompare<unsigned_int>
                    (&this->super_DrawIndirectBase,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e8,local_19c,
                     local_1a0,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,
                     local_19c,local_1a0,0,0);
  DIResult::sub_result
            ((DILogger *)
             &dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(DIResult *)&dataHeight,lVar4);
  DILogger::~DILogger((DILogger *)
                      &dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_500);
  DrawIndirectBase::DataGen<unsigned_int>
            (&this->super_DrawIndirectBase,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_500,local_19c,local_1a0,10
             ,0x46);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,this->_buffers[2]);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_500);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_500,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,sVar2 << 2,pvVar3,0x88e0);
  lVar4 = DrawIndirectBase::BindingPointCheck<glcts::(anonymous_namespace)::test_api::ES3>
                    (&this->super_DrawIndirectBase,this->_buffers[2]);
  DIResult::sub_result(&local_680,(DIResult *)&dataHeight,lVar4);
  DILogger::~DILogger(&local_680);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,0);
  DrawIndirectBase::GetBufferSubData<glcts::(anonymous_namespace)::test_api::ES3>
            (&this->super_DrawIndirectBase,0x8f3f,0,sVar2 << 2,pvVar3);
  lVar4 = DrawIndirectBase::DataCompare<unsigned_int>
                    (&this->super_DrawIndirectBase,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_500,local_19c,
                     local_1a0,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,
                     local_19c,local_1a0,0,0);
  DIResult::sub_result(&local_800,(DIResult *)&dataHeight,lVar4);
  DILogger::~DILogger(&local_800);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,this->_buffers[3]);
  glu::CallLogWrapper::glBufferData
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,300,(void *)0x0,0x88e4);
  lVar4 = DrawIndirectBase::BindingPointCheck<glcts::(anonymous_namespace)::test_api::ES3>
                    (&this->super_DrawIndirectBase,this->_buffers[3]);
  DIResult::sub_result(&local_980,(DIResult *)&dataHeight,lVar4);
  DILogger::~DILogger(&local_980);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,this->_buffers[4]);
  glu::CallLogWrapper::glBufferData
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,400,(void *)0x0,0x88e9);
  lVar4 = DrawIndirectBase::BindingPointCheck<glcts::(anonymous_namespace)::test_api::ES3>
                    (&this->super_DrawIndirectBase,this->_buffers[4]);
  DIResult::sub_result
            ((DILogger *)
             &dataRef5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(DIResult *)&dataHeight,lVar4);
  DILogger::~DILogger((DILogger *)
                      &dataRef5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b18);
  DrawIndirectBase::DataGen<unsigned_int>
            (&this->super_DrawIndirectBase,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b18,local_19c,local_1a0,0,
             0x32);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,this->_buffers[5]);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b18);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b18,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,sVar2 << 2,pvVar3,0x88e1);
  lVar4 = DrawIndirectBase::BindingPointCheck<glcts::(anonymous_namespace)::test_api::ES3>
                    (&this->super_DrawIndirectBase,this->_buffers[5]);
  DIResult::sub_result(&local_c98,(DIResult *)&dataHeight,lVar4);
  DILogger::~DILogger(&local_c98);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,0);
  DrawIndirectBase::GetBufferSubData<glcts::(anonymous_namespace)::test_api::ES3>
            (&this->super_DrawIndirectBase,0x8f3f,0,sVar2 << 2,pvVar3);
  lVar4 = DrawIndirectBase::DataCompare<unsigned_int>
                    (&this->super_DrawIndirectBase,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b18,local_19c,
                     local_1a0,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,
                     local_19c,local_1a0,0,0);
  DIResult::sub_result
            ((DILogger *)
             &dataRef6.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(DIResult *)&dataHeight,lVar4);
  DILogger::~DILogger((DILogger *)
                      &dataRef6.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e30);
  DrawIndirectBase::DataGen<unsigned_int>
            (&this->super_DrawIndirectBase,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e30,local_19c,local_1a0,10
             ,0x28);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,this->_buffers[6]);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e30);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e30,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,sVar2 << 2,pvVar3,0x88e5);
  lVar4 = DrawIndirectBase::BindingPointCheck<glcts::(anonymous_namespace)::test_api::ES3>
                    (&this->super_DrawIndirectBase,this->_buffers[6]);
  DIResult::sub_result(&local_fb0,(DIResult *)&dataHeight,lVar4);
  DILogger::~DILogger(&local_fb0);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,0);
  DrawIndirectBase::GetBufferSubData<glcts::(anonymous_namespace)::test_api::ES3>
            (&this->super_DrawIndirectBase,0x8f3f,0,sVar2 << 2,pvVar3);
  lVar4 = DrawIndirectBase::DataCompare<unsigned_int>
                    (&this->super_DrawIndirectBase,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e30,local_19c,
                     local_1a0,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,
                     local_19c,local_1a0,0,0);
  DIResult::sub_result
            ((DILogger *)
             &dataRef7.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(DIResult *)&dataHeight,lVar4);
  DILogger::~DILogger((DILogger *)
                      &dataRef7.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1148);
  DrawIndirectBase::DataGen<unsigned_int>
            (&this->super_DrawIndirectBase,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1148,local_19c,local_1a0,4
             ,0x46);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,this->_buffers[7]);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1148);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1148,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,sVar2 << 2,pvVar3,0x88ea);
  lVar4 = DrawIndirectBase::BindingPointCheck<glcts::(anonymous_namespace)::test_api::ES3>
                    (&this->super_DrawIndirectBase,this->_buffers[7]);
  DIResult::sub_result(&local_12c8,(DIResult *)&dataHeight,lVar4);
  DILogger::~DILogger(&local_12c8);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,0);
  DrawIndirectBase::GetBufferSubData<glcts::(anonymous_namespace)::test_api::ES3>
            (&this->super_DrawIndirectBase,0x8f3f,0,sVar2 << 2,pvVar3);
  lVar4 = DrawIndirectBase::DataCompare<unsigned_int>
                    (&this->super_DrawIndirectBase,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1148,local_19c,
                     local_1a0,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,
                     local_19c,local_1a0,0,0);
  DIResult::sub_result(&local_1448,(DIResult *)&dataHeight,lVar4);
  DILogger::~DILogger(&local_1448);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,this->_buffers[8]);
  glu::CallLogWrapper::glBufferData
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,800,(void *)0x0,0x88e2);
  lVar4 = DrawIndirectBase::BindingPointCheck<glcts::(anonymous_namespace)::test_api::ES3>
                    (&this->super_DrawIndirectBase,this->_buffers[8]);
  DIResult::sub_result
            ((DILogger *)
             &dataRef9.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(DIResult *)&dataHeight,lVar4);
  DILogger::~DILogger((DILogger *)
                      &dataRef9.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_15e0);
  DrawIndirectBase::DataGen<unsigned_int>
            (&this->super_DrawIndirectBase,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_15e0,local_19c,local_1a0,
             0x12,0x23);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,this->_buffers[9]);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_15e0);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_15e0,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,sVar2 << 2,pvVar3,0x88e6);
  lVar4 = DrawIndirectBase::BindingPointCheck<glcts::(anonymous_namespace)::test_api::ES3>
                    (&this->super_DrawIndirectBase,this->_buffers[9]);
  DIResult::sub_result(&local_1760,(DIResult *)&dataHeight,lVar4);
  DILogger::~DILogger(&local_1760);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,0);
  DrawIndirectBase::GetBufferSubData<glcts::(anonymous_namespace)::test_api::ES3>
            (&this->super_DrawIndirectBase,0x8f3f,0,sVar2 << 2,pvVar3);
  lVar4 = DrawIndirectBase::DataCompare<unsigned_int>
                    (&this->super_DrawIndirectBase,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_15e0,local_19c,
                     local_1a0,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,
                     local_19c,local_1a0,0,0);
  DIResult::sub_result(&local_18e0,(DIResult *)&dataHeight,lVar4);
  DILogger::~DILogger(&local_18e0);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_15e0);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_15e0,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,sVar2 << 2,pvVar3,0x88e6);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,0);
  DrawIndirectBase::GetBufferSubData<glcts::(anonymous_namespace)::test_api::ES3>
            (&this->super_DrawIndirectBase,0x8f3f,0,sVar2 << 2,pvVar3);
  lVar4 = DrawIndirectBase::DataCompare<unsigned_int>
                    (&this->super_DrawIndirectBase,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_15e0,local_19c,
                     local_1a0,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,
                     local_19c,local_1a0,0,0);
  DIResult::sub_result(&local_1a60,(DIResult *)&dataHeight,lVar4);
  DILogger::~DILogger(&local_1a60);
  DrawIndirectBase::DataGen<unsigned_int>
            (&this->super_DrawIndirectBase,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_15e0,local_19c * 2,
             local_1a0 * 2,0x12,0x23);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_15e0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,sVar2);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_15e0);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_15e0,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,sVar2 << 2,pvVar3,0x88e6);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,0);
  DrawIndirectBase::GetBufferSubData<glcts::(anonymous_namespace)::test_api::ES3>
            (&this->super_DrawIndirectBase,0x8f3f,0,sVar2 << 2,pvVar3);
  lVar4 = DrawIndirectBase::DataCompare<unsigned_int>
                    (&this->super_DrawIndirectBase,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_15e0,local_19c * 2
                     ,local_1a0 * 2,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8
                     ,local_19c * 2,local_1a0 * 2,0,0);
  DIResult::sub_result(&local_1be0,(DIResult *)&dataHeight,lVar4);
  DILogger::~DILogger(&local_1be0);
  DrawIndirectBase::DataGen<unsigned_int>
            (&this->super_DrawIndirectBase,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_15e0,(int)local_19c / 2,
             (int)local_1a0 / 2,0x12,0x23);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_15e0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,sVar2);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_15e0);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_15e0,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,sVar2 << 2,pvVar3,0x88e6);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,0);
  DrawIndirectBase::GetBufferSubData<glcts::(anonymous_namespace)::test_api::ES3>
            (&this->super_DrawIndirectBase,0x8f3f,0,sVar2 << 2,pvVar3);
  lVar4 = DrawIndirectBase::DataCompare<unsigned_int>
                    (&this->super_DrawIndirectBase,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_15e0,
                     (int)local_19c / 2,(int)local_1a0 / 2,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,
                     (int)local_19c / 2,(int)local_1a0 / 2,0,0);
  DIResult::sub_result(&local_1d60,(DIResult *)&dataHeight,lVar4);
  DILogger::~DILogger(&local_1d60);
  lVar4 = DIResult::code((DIResult *)&dataHeight);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_15e0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e30);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_500);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8);
  DIResult::~DIResult((DIResult *)&dataHeight);
  return lVar4;
}

Assistant:

virtual long Run()
	{
		DIResult result;

		int dataWidth, dataHeight;
		getDataSize(dataWidth, dataHeight);

		CDataArray dataTest(dataWidth * dataHeight, 0);

		glGenBuffers(sizeof(_buffers) / sizeof(_buffers[0]), _buffers);
		CDataArray dataRef1;
		DataGen<unsigned int>(dataRef1, dataWidth, dataHeight, 0, 50);

		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffers[1]);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef1.size() * sizeof(unsigned int)), &dataRef1[0],
					 GL_DYNAMIC_DRAW);
		result.sub_result(BindingPointCheck<api>(_buffers[1]));

		GetBufferSubData<api>(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataTest.size() * sizeof(unsigned int)),
							  &dataTest[0]);
		result.sub_result(DataCompare(dataRef1, dataWidth, dataHeight, dataTest, dataWidth, dataHeight));

		CDataArray dataRef2;
		DataGen<unsigned int>(dataRef2, dataWidth, dataHeight, 10, 70);

		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffers[2]);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef2.size() * sizeof(unsigned int)), &dataRef2[0],
					 GL_STREAM_DRAW);
		result.sub_result(BindingPointCheck<api>(_buffers[2]));

		GetBufferSubData<api>(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataTest.size() * sizeof(unsigned int)),
							  &dataTest[0]);
		result.sub_result(DataCompare(dataRef2, dataWidth, dataHeight, dataTest, dataWidth, dataHeight));

		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffers[3]);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, 300, NULL, GL_STATIC_DRAW);
		result.sub_result(BindingPointCheck<api>(_buffers[3]));

		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffers[4]);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, 400, NULL, GL_DYNAMIC_READ);
		result.sub_result(BindingPointCheck<api>(_buffers[4]));

		CDataArray dataRef5;
		DataGen<unsigned int>(dataRef5, dataWidth, dataHeight, 0, 50);

		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffers[5]);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef5.size() * sizeof(unsigned int)), &dataRef5[0],
					 GL_STREAM_READ);
		result.sub_result(BindingPointCheck<api>(_buffers[5]));

		GetBufferSubData<api>(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataTest.size() * sizeof(unsigned int)),
							  &dataTest[0]);
		result.sub_result(DataCompare(dataRef5, dataWidth, dataHeight, dataTest, dataWidth, dataHeight));

		CDataArray dataRef6;
		DataGen<unsigned int>(dataRef6, dataWidth, dataHeight, 10, 40);

		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffers[6]);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef6.size() * sizeof(unsigned int)), &dataRef6[0],
					 GL_STATIC_READ);
		result.sub_result(BindingPointCheck<api>(_buffers[6]));

		GetBufferSubData<api>(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataTest.size() * sizeof(unsigned int)),
							  &dataTest[0]);
		result.sub_result(DataCompare(dataRef6, dataWidth, dataHeight, dataTest, dataWidth, dataHeight));

		CDataArray dataRef7;
		DataGen<unsigned int>(dataRef7, dataWidth, dataHeight, 4, 70);

		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffers[7]);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef7.size() * sizeof(unsigned int)), &dataRef7[0],
					 GL_DYNAMIC_COPY);
		result.sub_result(BindingPointCheck<api>(_buffers[7]));

		GetBufferSubData<api>(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataTest.size() * sizeof(unsigned int)),
							  &dataTest[0]);
		result.sub_result(DataCompare(dataRef7, dataWidth, dataHeight, dataTest, dataWidth, dataHeight));

		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffers[8]);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, 800, NULL, GL_STREAM_COPY);
		result.sub_result(BindingPointCheck<api>(_buffers[8]));

		CDataArray dataRef9;
		DataGen<unsigned int>(dataRef9, dataWidth, dataHeight, 18, 35);

		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffers[9]);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef9.size() * sizeof(unsigned int)), &dataRef9[0],
					 GL_STATIC_COPY);
		result.sub_result(BindingPointCheck<api>(_buffers[9]));

		GetBufferSubData<api>(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataTest.size() * sizeof(unsigned int)),
							  &dataTest[0]);
		result.sub_result(DataCompare(dataRef9, dataWidth, dataHeight, dataTest, dataWidth, dataHeight));

		//reallocation: same size
		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef9.size() * sizeof(unsigned int)), &dataRef9[0],
					 GL_STATIC_COPY);
		GetBufferSubData<api>(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataTest.size() * sizeof(unsigned int)),
							  &dataTest[0]);
		result.sub_result(DataCompare(dataRef9, dataWidth, dataHeight, dataTest, dataWidth, dataHeight));

		//reallocation: larger size
		DataGen<unsigned int>(dataRef9, dataWidth * 2, dataHeight * 2, 18, 35);
		dataTest.resize(dataRef9.size());
		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef9.size() * sizeof(unsigned int)), &dataRef9[0],
					 GL_STATIC_COPY);
		GetBufferSubData<api>(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataTest.size() * sizeof(unsigned int)),
							  &dataTest[0]);
		result.sub_result(
			DataCompare(dataRef9, dataWidth * 2, dataHeight * 2, dataTest, dataWidth * 2, dataHeight * 2));

		//reallocation: smaller size
		DataGen<unsigned int>(dataRef9, dataWidth / 2, dataHeight / 2, 18, 35);
		dataTest.resize(dataRef9.size());
		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef9.size() * sizeof(unsigned int)), &dataRef9[0],
					 GL_STATIC_COPY);
		GetBufferSubData<api>(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataTest.size() * sizeof(unsigned int)),
							  &dataTest[0]);
		result.sub_result(
			DataCompare(dataRef9, dataWidth / 2, dataHeight / 2, dataTest, dataWidth / 2, dataHeight / 2));

		return result.code();
	}